

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CAnimatedMeshSceneNode::CAnimatedMeshSceneNode
          (CAnimatedMeshSceneNode *this,IAnimatedMesh *mesh,ISceneNode *parent,ISceneManager *mgr,
          s32 id,vector3df *position,vector3df *rotation,vector3df *scale)

{
  undefined8 in_RCX;
  s32 id_00;
  ISceneManager *in_RDX;
  ISceneNode *in_RSI;
  void **in_RDI;
  undefined4 in_R8D;
  IAnimatedMeshSceneNode *unaff_retaddr;
  array<irr::core::CMatrix4<float>_> *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  void **vtt;
  
  id_00 = (s32)((ulong)in_RCX >> 0x20);
  vtt = in_RDI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x33));
  IAnimatedMeshSceneNode::IAnimatedMeshSceneNode
            (unaff_retaddr,vtt,in_RSI,in_RDX,id_00,
             (vector3df *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),(vector3df *)in_stack_00000010,
             position);
  *in_RDI = vtable + 0x18;
  in_RDI[0x33] = vtable + 0x1f8;
  core::array<irr::video::SMaterial>::array((array<irr::video::SMaterial> *)in_stack_00000010);
  core::aabbox3d<float>::aabbox3d((aabbox3d<float> *)in_stack_00000010);
  in_RDI[0x23] = (void *)0x0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)((long)in_RDI + 0x124) = 0;
  *(undefined4 *)(in_RDI + 0x25) = 0x3ccccccd;
  *(undefined4 *)((long)in_RDI + 300) = 0;
  *(undefined4 *)(in_RDI + 0x26) = 0;
  *(undefined4 *)((long)in_RDI + 0x134) = 0;
  *(undefined4 *)(in_RDI + 0x27) = 0;
  *(undefined4 *)((long)in_RDI + 0x13c) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined1 *)((long)in_RDI + 0x144) = 0;
  *(undefined1 *)((long)in_RDI + 0x145) = 1;
  *(undefined1 *)((long)in_RDI + 0x146) = 0;
  *(undefined1 *)((long)in_RDI + 0x147) = 0;
  in_RDI[0x29] = (void *)0x0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  core::array<irr::scene::IBoneSceneNode_*>::array
            ((array<irr::scene::IBoneSceneNode_*> *)in_stack_00000010);
  core::array<irr::core::CMatrix4<float>_>::array(in_stack_00000010);
  (**(code **)((long)*in_RDI + 0x198))(in_RDI,in_RSI);
  return;
}

Assistant:

CAnimatedMeshSceneNode::CAnimatedMeshSceneNode(IAnimatedMesh *mesh,
		ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position,
		const core::vector3df &rotation,
		const core::vector3df &scale) :
		IAnimatedMeshSceneNode(parent, mgr, id, position, rotation, scale),
		Mesh(0),
		StartFrame(0), EndFrame(0), FramesPerSecond(0.025f),
		CurrentFrameNr(0.f), LastTimeMs(0),
		TransitionTime(0), Transiting(0.f), TransitingBlend(0.f),
		JointMode(EJUOR_NONE), JointsUsed(false),
		Looping(true), ReadOnlyMaterials(false), RenderFromIdentity(false),
		LoopCallBack(0), PassCount(0)
{
#ifdef _DEBUG
	setDebugName("CAnimatedMeshSceneNode");
#endif

	setMesh(mesh);
}